

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_GetDevice
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,char *deviceId,
          IOTHUB_DEVICE *deviceInfo)

{
  undefined1 local_d0 [8];
  IOTHUB_DEVICE_OR_MODULE deviceOrModuleInfo;
  LOGGER_LOG l;
  IOTHUB_REGISTRYMANAGER_RESULT result;
  IOTHUB_DEVICE *deviceInfo_local;
  char *deviceId_local;
  IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle_local;
  
  if (((registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) || (deviceId == (char *)0x0))
     || (deviceInfo == (IOTHUB_DEVICE *)0x0)) {
    deviceOrModuleInfo.managedBy = (char *)xlogging_get_log_function();
    if ((LOGGER_LOG)deviceOrModuleInfo.managedBy != (LOGGER_LOG)0x0) {
      (*(code *)deviceOrModuleInfo.managedBy)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                 ,"IoTHubRegistryManager_GetDevice",0x642,1,"Input parameter cannot be NULL");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
  }
  else {
    memset(local_d0,0,0xa0);
    l._4_4_ = IoTHubRegistryManager_GetDeviceOrModule
                        (registryManagerHandle,deviceId,(char *)0x0,
                         (IOTHUB_DEVICE_OR_MODULE *)local_d0);
    if (l._4_4_ == IOTHUB_REGISTRYMANAGER_OK) {
      move_deviceOrModule_members_to_device((IOTHUB_DEVICE_OR_MODULE *)local_d0,deviceInfo);
      free_nonDevice_members_from_deviceOrModule((IOTHUB_DEVICE_OR_MODULE *)local_d0);
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_GetDevice(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, const char* deviceId, IOTHUB_DEVICE* deviceInfo)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceId == NULL) || (deviceInfo == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else
    {
        IOTHUB_DEVICE_OR_MODULE deviceOrModuleInfo;
        memset(&deviceOrModuleInfo, 0, sizeof(deviceOrModuleInfo));

        result = IoTHubRegistryManager_GetDeviceOrModule(registryManagerHandle, deviceId, NULL, &deviceOrModuleInfo);
        if (result == IOTHUB_REGISTRYMANAGER_OK)
        {
            move_deviceOrModule_members_to_device(&deviceOrModuleInfo, deviceInfo);
            free_nonDevice_members_from_deviceOrModule(&deviceOrModuleInfo);
        }
    }

    return result;
}